

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void quantize_row_q4_1_ref(float *x,block_q4_1 *y,int64_t k)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  int j;
  long lVar9;
  uint32_t w;
  float fVar10;
  float fVar11;
  uint uVar12;
  float fVar13;
  uint uVar18;
  float fVar19;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar20;
  uint uVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  
  auVar5 = _DAT_0014e690;
  auVar4 = _DAT_0014e670;
  auVar3 = _DAT_0014e5d0;
  lVar9 = k + 0x1f;
  if (-1 < k) {
    lVar9 = k;
  }
  uVar6 = (uint)(lVar9 >> 5);
  if (0 < (int)uVar6) {
    puVar7 = y->qs;
    uVar8 = 0;
    do {
      lVar9 = 0;
      fVar10 = -3.4028235e+38;
      fVar13 = 3.4028235e+38;
      do {
        fVar19 = x[lVar9];
        fVar11 = fVar19;
        if (fVar13 <= fVar19) {
          fVar11 = fVar13;
        }
        if (fVar19 <= fVar10) {
          fVar19 = fVar10;
        }
        lVar9 = lVar9 + 1;
        fVar10 = fVar19;
        fVar13 = fVar11;
      } while (lVar9 != 0x20);
      fVar10 = (fVar19 - fVar11) / 15.0;
      uVar20 = (int)fVar10 * 2 ^ 0x80000000;
      uVar22 = (int)fVar11 * 2 ^ 0x80000000;
      uVar12 = -(uint)(-0xf000001 < (int)uVar20);
      uVar18 = -(uint)(-0xf000001 < (int)uVar22);
      fVar13 = (float)(~uVar12 & 0x40000000 | ((uint)fVar10 & 0x7f800000) + 0x7800000 & uVar12) +
               ABS(fVar10) * 5.192297e+33 * 7.70372e-34;
      fVar19 = (float)(~uVar18 & 0x40000000 | ((uint)fVar11 & 0x7f800000) + 0x7800000 & uVar18) +
               ABS(fVar11) * 5.192297e+33 * 7.70372e-34;
      auVar14._0_4_ = ((uint)fVar13 & 0xfff) + ((uint)fVar13 >> 0xd & 0x7c00);
      auVar14._4_4_ = ((uint)fVar19 & 0xfff) + ((uint)fVar19 >> 0xd & 0x7c00);
      auVar14._8_8_ = 0;
      auVar17._0_4_ = -(uint)(0x7f000000 < (int)uVar20);
      auVar17._4_4_ = -(uint)(0x7f000000 < (int)uVar22);
      auVar17._8_8_ = 0;
      auVar23._0_4_ = (uint)fVar10 >> 0x10;
      auVar23._4_4_ = (uint)fVar11 >> 0x10;
      auVar23._8_8_ = 0;
      auVar14 = pshuflw(auVar14,auVar17 & auVar5 | auVar23 & auVar4 | ~auVar17 & auVar14,0xe8);
      y[uVar8].field_0.dm = auVar14._0_4_;
      fVar10 = (float)(-(uint)(fVar10 != 0.0) & (uint)(1.0 / fVar10));
      lVar9 = 0;
      do {
        pfVar1 = x + lVar9;
        pfVar2 = x + lVar9 + 0x10;
        auVar15._0_4_ = (int)((*pfVar1 - fVar11) * fVar10 + 0.5);
        auVar15._4_4_ = (int)((pfVar1[1] - fVar11) * fVar10 + 0.5);
        auVar15._8_4_ = (int)((pfVar1[2] - fVar11) * fVar10 + 0.5);
        auVar15._12_4_ = (int)((pfVar1[3] - fVar11) * fVar10 + 0.5);
        auVar14 = packssdw(auVar15,auVar15);
        auVar14 = packsswb(auVar14,auVar14);
        uVar12 = CONCAT13(-(auVar14[3] < auVar3[3]),
                          CONCAT12(-(auVar14[2] < auVar3[2]),
                                   CONCAT11(-(auVar14[1] < auVar3[1]),-(auVar14[0] < auVar3[0]))));
        auVar16._0_4_ = (int)((*pfVar2 - fVar11) * fVar10 + 0.5);
        auVar16._4_4_ = (int)((pfVar2[1] - fVar11) * fVar10 + 0.5);
        auVar16._8_4_ = (int)((pfVar2[2] - fVar11) * fVar10 + 0.5);
        auVar16._12_4_ = (int)((pfVar2[3] - fVar11) * fVar10 + 0.5);
        auVar17 = packssdw(auVar16,auVar16);
        auVar17 = packsswb(auVar17,auVar17);
        auVar21[0] = -(auVar17[0] < auVar3[0]);
        auVar21[1] = -(auVar17[1] < auVar3[1]);
        auVar21[2] = -(auVar17[2] < auVar3[2]);
        auVar21[3] = -(auVar17[3] < auVar3[3]);
        auVar21[4] = -(auVar17[4] < auVar3[4]);
        auVar21[5] = -(auVar17[5] < auVar3[5]);
        auVar21[6] = -(auVar17[6] < auVar3[6]);
        auVar21[7] = -(auVar17[7] < auVar3[7]);
        auVar21[8] = -(auVar17[8] < auVar3[8]);
        auVar21[9] = -(auVar17[9] < auVar3[9]);
        auVar21[10] = -(auVar17[10] < auVar3[10]);
        auVar21[0xb] = -(auVar17[0xb] < auVar3[0xb]);
        auVar21[0xc] = -(auVar17[0xc] < auVar3[0xc]);
        auVar21[0xd] = -(auVar17[0xd] < auVar3[0xd]);
        auVar21[0xe] = -(auVar17[0xe] < auVar3[0xe]);
        auVar21[0xf] = -(auVar17[0xf] < auVar3[0xf]);
        auVar17 = psllw(~auVar21 & auVar3 | auVar17 & auVar21,4);
        *(uint *)(puVar7 + lVar9) =
             auVar17._0_4_ & 0xf0f0f0f0 | ~uVar12 & auVar3._0_4_ | auVar14._0_4_ & uVar12;
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0x10);
      uVar8 = uVar8 + 1;
      x = x + 0x20;
      puVar7 = puVar7 + 0x14;
    } while (uVar8 != (uVar6 & 0x7fffffff));
  }
  return;
}

Assistant:

void quantize_row_q4_1_ref(const float * GGML_RESTRICT x, block_q4_1 * GGML_RESTRICT y, int64_t k) {
    const int qk = QK4_1;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        float min = FLT_MAX;
        float max = -FLT_MAX;

        for (int j = 0; j < qk; j++) {
            const float v = x[i*qk + j];

            if (v < min) min = v;
            if (v > max) max = v;
        }

        const float d  = (max - min) / ((1 << 4) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);
        y[i].m = GGML_FP32_TO_FP16(min);

        for (int j = 0; j < qk/2; ++j) {
            const float x0 = (x[i*qk + 0    + j] - min)*id;
            const float x1 = (x[i*qk + qk/2 + j] - min)*id;

            const uint8_t xi0 = MIN(15, (int8_t)(x0 + 0.5f));
            const uint8_t xi1 = MIN(15, (int8_t)(x1 + 0.5f));

            y[i].qs[j]  = xi0;
            y[i].qs[j] |= xi1 << 4;
        }
    }
}